

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

ZSTDVectorScanState * __thiscall
duckdb::ZSTDScanState::LoadVector(ZSTDScanState *this,idx_t vector_idx,idx_t internal_offset)

{
  unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
  *this_00;
  string_length_t *psVar1;
  uint uVar2;
  element_type *__p;
  bool bVar3;
  type pZVar4;
  pointer pZVar5;
  data_ptr_t pdVar6;
  long lVar7;
  idx_t iVar8;
  shared_ptr<duckdb::BlockHandle,_true> block;
  BufferHandle data_handle;
  uncompressed_size_t uStack_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  bVar3 = UseVectorStateCache(this,vector_idx,internal_offset);
  if (bVar3) {
    pZVar4 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
             ::operator*(&this->current_vector);
    return pZVar4;
  }
  make_uniq<duckdb::ZSTDVectorScanState>();
  __p = data_handle.handle.internal.
        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &this->current_vector;
  data_handle.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>::
  reset((__uniq_ptr_impl<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>
         *)this_00,(pointer)__p);
  ::std::unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>
  ::~unique_ptr((unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>
                 *)&data_handle);
  GetVectorMetadata((ZSTDVectorScanMetadata *)&data_handle,this,vector_idx);
  pZVar5 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
           ::operator->(this_00);
  (pZVar5->metadata).vector_idx =
       (idx_t)data_handle.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pZVar5->metadata).block_id =
       (block_id_t)
       data_handle.handle.internal.
       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(FileBuffer **)&(pZVar5->metadata).block_offset = data_handle.node.ptr;
  (pZVar5->metadata).uncompressed_size = uStack_40;
  (pZVar5->metadata).compressed_size = (compressed_size_t)local_38;
  (pZVar5->metadata).count = (idx_t)_Stack_30._M_pi;
  pZVar5 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
           ::operator->(this_00);
  pZVar4 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
           ::operator*(this_00);
  if ((pZVar5->metadata).block_id == -1) {
    pdVar6 = BufferHandle::Ptr(&this->segment_handle);
    lVar7 = this->segment_block_offset + 3;
  }
  else {
    LoadPage((ZSTDScanState *)&block,(block_id_t)this);
    (*this->buffer_manager->_vptr_BufferManager[7])(&data_handle,this->buffer_manager,&block);
    pdVar6 = BufferHandle::Ptr(&data_handle);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
    emplace_back<duckdb::BufferHandle>
              (&(pZVar4->buffer_handles).
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
               &data_handle);
    BufferHandle::~BufferHandle(&data_handle);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar7 = 3;
  }
  uVar2 = (pZVar5->metadata).block_offset;
  iVar8 = (pZVar5->metadata).count;
  pZVar4->string_lengths = (string_length_t *)(pdVar6 + ((ulong)uVar2 + lVar7 & 0xfffffffffffffffc))
  ;
  psVar1 = (string_length_t *)
           ((long)(pdVar6 + ((ulong)uVar2 + lVar7 & 0xfffffffffffffffc)) + iVar8 * 4);
  pZVar4->current_buffer_ptr = (data_ptr_t)psVar1;
  (pZVar4->in_buffer).src = psVar1;
  (pZVar4->in_buffer).pos = 0;
  iVar8 = BlockManager::GetBlockSize(this->block_manager);
  (pZVar4->in_buffer).size = (size_t)(pdVar6 + (iVar8 - (long)psVar1) + -8);
  duckdb_zstd::ZSTD_DCtx_reset(this->decompression_context,ZSTD_reset_session_only);
  duckdb_zstd::ZSTD_DCtx_refDDict(this->decompression_context,(ZSTD_DDict *)0x0);
  if (internal_offset != 0) {
    Skip(this,pZVar4,internal_offset);
  }
  return pZVar4;
}

Assistant:

ZSTDVectorScanState &LoadVector(idx_t vector_idx, idx_t internal_offset) {
		if (UseVectorStateCache(vector_idx, internal_offset)) {
			return *current_vector;
		}
		current_vector = make_uniq<ZSTDVectorScanState>();
		current_vector->metadata = GetVectorMetadata(vector_idx);
		auto &metadata = current_vector->metadata;
		auto &scan_state = *current_vector;
		data_ptr_t handle_start;
		idx_t ptr_offset = 0;
		if (metadata.block_id == INVALID_BLOCK) {
			// Data lives on the segment's page
			handle_start = segment_handle.Ptr();
			ptr_offset += segment_block_offset;
		} else {
			// Data lives on an extra page, have to load the block first
			auto block = LoadPage(metadata.block_id);
			auto data_handle = buffer_manager.Pin(block);
			handle_start = data_handle.Ptr();
			scan_state.buffer_handles.push_back(std::move(data_handle));
		}

		ptr_offset += metadata.block_offset;
		ptr_offset = AlignValue<idx_t, sizeof(string_length_t)>(ptr_offset);
		scan_state.current_buffer_ptr = handle_start + ptr_offset;

		auto vector_size = metadata.count;

		scan_state.string_lengths = reinterpret_cast<string_length_t *>(scan_state.current_buffer_ptr);
		scan_state.current_buffer_ptr += (sizeof(string_length_t) * vector_size);

		// Update the in_buffer to point to the start of the compressed data frame
		idx_t current_offset = UnsafeNumericCast<idx_t>(scan_state.current_buffer_ptr - handle_start);
		scan_state.in_buffer.src = scan_state.current_buffer_ptr;
		scan_state.in_buffer.pos = 0;
		scan_state.in_buffer.size = block_manager.GetBlockSize() - sizeof(block_id_t) - current_offset;

		// Initialize the context for streaming decompression
		duckdb_zstd::ZSTD_DCtx_reset(decompression_context, duckdb_zstd::ZSTD_reset_session_only);
		duckdb_zstd::ZSTD_DCtx_refDDict(decompression_context, nullptr);

		if (internal_offset) {
			Skip(scan_state, internal_offset);
		}
		return scan_state;
	}